

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier_ooura.cc
# Opt level: O2

void __thiscall webrtc::RealFourierOoura::RealFourierOoura(RealFourierOoura *this,int fft_order)

{
  size_t sVar1;
  ulong uVar2;
  unsigned_long *__s;
  float *__s_00;
  string *result;
  float fVar3;
  FatalMessage FStack_1a8;
  
  (this->super_RealFourier)._vptr_RealFourier = (_func_int **)&PTR__RealFourierOoura_001d3cb8;
  this->order_ = fft_order;
  sVar1 = RealFourier::FftLength(fft_order);
  this->length_ = sVar1;
  sVar1 = RealFourier::ComplexLength(this->order_);
  this->complex_length_ = sVar1;
  fVar3 = ceilf(SQRT((float)this->length_));
  uVar2 = (ulong)(fVar3 + 2.0);
  uVar2 = (long)((fVar3 + 2.0) - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  uVar2 = -(ulong)(uVar2 >> 0x3d != 0) | uVar2 << 3;
  __s = (unsigned_long *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  (this->work_ip_)._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = __s;
  uVar2 = -(ulong)(sVar1 >> 0x3e != 0) | sVar1 << 2;
  __s_00 = (float *)operator_new__(uVar2);
  memset(__s_00,0,uVar2);
  (this->work_w_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s_00;
  result = rtc::CheckGEImpl_abi_cxx11_(fft_order,1,"fft_order >= 1");
  if (result == (string *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&FStack_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/real_fourier_ooura.cc"
             ,0x2d,result);
  rtc::FatalMessage::~FatalMessage(&FStack_1a8);
}

Assistant:

RealFourierOoura::RealFourierOoura(int fft_order)
    : order_(fft_order),
      length_(FftLength(order_)),
      complex_length_(ComplexLength(order_)),
      // Zero-initializing work_ip_ will cause rdft to initialize these work
      // arrays on the first call.
      work_ip_(new size_t[ComputeWorkIpSize(length_)]()),
      work_w_(new float[complex_length_]()) {
  RTC_CHECK_GE(fft_order, 1);
}